

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EllypticPoint.cpp
# Opt level: O0

void __thiscall EllypticPoint::EllypticPoint(EllypticPoint *this)

{
  BigInteger local_60;
  BigInteger local_40;
  EllypticPoint *local_10;
  EllypticPoint *this_local;
  
  local_10 = this;
  BigIntegerLibrary::BigInteger::BigInteger(&this->x);
  BigIntegerLibrary::BigInteger::BigInteger(&this->y);
  BigIntegerLibrary::BigInteger::BigInteger(&this->p,0x43);
  BigIntegerLibrary::BigInteger::BigInteger(&this->a,2);
  BigIntegerLibrary::BigInteger::BigInteger(&local_40,0);
  BigIntegerLibrary::BigInteger::operator=(&this->x,&local_40);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_40);
  BigIntegerLibrary::BigInteger::BigInteger(&local_60,0);
  BigIntegerLibrary::BigInteger::operator=(&this->y,&local_60);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_60);
  return;
}

Assistant:

EllypticPoint::EllypticPoint() {
    x = 0;
    y = 0;
}